

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsDisposeRuntime(JsRuntimeHandle runtimeHandle)

{
  ThreadContext *threadContext;
  Recycler *this;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JsrtDebugManager *pJVar4;
  undefined4 *puVar5;
  JsrtRuntime *runtime;
  JsErrorCode JVar6;
  ScriptContext *scriptContext;
  AutoNestedHandledExceptionType local_58 [2];
  TTDebuggerAbortException anon_var_0;
  ThreadContextScope local_30;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar6 = JsErrorInvalidArgument;
    goto LAB_00369554;
  }
  ThreadContext::ValidateThreadContext(*runtimeHandle);
  threadContext = *runtimeHandle;
  ThreadContextScope::ThreadContextScope(&local_30,threadContext);
  JVar6 = JsErrorRuntimeInUse;
  if ((local_30.isValid == true) && (local_30.wasInUse == false)) {
    if (threadContext->recycler != (Recycler *)0x0) {
      bVar2 = Memory::Recycler::IsHeapEnumInProgress(threadContext->recycler);
      if (bVar2) goto LAB_0036954b;
    }
    JVar6 = JsErrorInThreadServiceCallback;
    if ((threadContext->threadService).isInCallback == false) {
      if (threadContext->recycler != (Recycler *)0x0) {
        Memory::Recycler::ClearObjectBeforeCollectCallbacks(threadContext->recycler);
      }
      pJVar4 = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
      if (pJVar4 != (JsrtDebugManager *)0x0) {
        pJVar4 = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
        JsrtDebugManager::ClearDebuggerObjects(pJVar4);
      }
      for (scriptContext = threadContext->scriptContextList; scriptContext != (ScriptContext *)0x0;
          scriptContext = scriptContext->next) {
        pJVar4 = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
        if (pJVar4 != (JsrtDebugManager *)0x0) {
          pJVar4 = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
          JsrtDebugManager::ClearDebugDocument(pJVar4,scriptContext);
        }
        Js::ScriptContext::MarkForClose(scriptContext);
      }
      JsrtRuntime::CloseContexts((JsrtRuntime *)runtimeHandle);
      JsrtRuntime::DeleteJsrtDebugManager((JsrtRuntime *)runtimeHandle);
      bVar2 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,LeakReportFlag);
      if ((bVar2 || DAT_015933ad != '\0') &&
         (this = threadContext->recycler, this != (Recycler *)0x0)) {
        Memory::Recycler::EnsureNotCollecting(this);
        Memory::Recycler::CollectNow<(Memory::CollectionFlags)553963520>(this);
        BVar3 = Memory::Recycler::CollectionInProgress(this);
        if (BVar3 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                             ,0x247,"(!recycler->CollectionInProgress())",
                             "!recycler->CollectionInProgress()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
      }
      JsrtRuntime::SetBeforeCollectCallback
                ((JsrtRuntime *)runtimeHandle,(JsBeforeCollectCallback)0x0,(void *)0x0);
      ThreadContext::CloseForJSRT(threadContext);
      ThreadContext::~ThreadContext(threadContext);
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,threadContext,0x1760);
      JsrtRuntime::~JsrtRuntime((JsrtRuntime *)runtimeHandle);
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,runtimeHandle,0x70);
      local_30.isValid = false;
      JVar6 = JsNoError;
    }
  }
LAB_0036954b:
  ThreadContextScope::~ThreadContextScope(&local_30);
LAB_00369554:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
  return JVar6;
}

Assistant:

CHAKRA_API JsDisposeRuntime(_In_ JsRuntimeHandle runtimeHandle)
{
    return GlobalAPIWrapper_NoRecord([&] () -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
        ThreadContext * threadContext = runtime->GetThreadContext();
        ThreadContextScope scope(threadContext);

        // We should not dispose if the runtime is being used.
        if (!scope.IsValid() ||
            scope.WasInUse() ||
            (threadContext->GetRecycler() && threadContext->GetRecycler()->IsHeapEnumInProgress()))
        {
            return JsErrorRuntimeInUse;
        }
        else if (threadContext->IsInThreadServiceCallback())
        {
            return JsErrorInThreadServiceCallback;
        }

        // Invoke and clear the callbacks while the contexts and runtime are still available
        {
            Recycler* recycler = threadContext->GetRecycler();
            if (recycler != nullptr)
            {
                recycler->ClearObjectBeforeCollectCallbacks();
            }
        }
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (runtime->GetJsrtDebugManager() != nullptr)
        {
            runtime->GetJsrtDebugManager()->ClearDebuggerObjects();
        }
#endif
        Js::ScriptContext *scriptContext;
        for (scriptContext = threadContext->GetScriptContextList(); scriptContext; scriptContext = scriptContext->next)
        {
#ifdef ENABLE_SCRIPT_DEBUGGING
            if (runtime->GetJsrtDebugManager() != nullptr)
            {
                runtime->GetJsrtDebugManager()->ClearDebugDocument(scriptContext);
            }
#endif
            scriptContext->MarkForClose();
        }

        // Close any open Contexts.
        // We need to do this before recycler shutdown, because ScriptEngine->Close won't work then.
        runtime->CloseContexts();

#ifdef ENABLE_SCRIPT_DEBUGGING
        runtime->DeleteJsrtDebugManager();
#endif

#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
        bool doFinalGC = false;

#if defined(LEAK_REPORT)
        if (Js::Configuration::Global.flags.IsEnabled(Js::LeakReportFlag))
        {
            doFinalGC = true;
        }
#endif

#if defined(CHECK_MEMORY_LEAK)
        if (Js::Configuration::Global.flags.CheckMemoryLeak)
        {
            doFinalGC = true;
        }
#endif

        if (doFinalGC)
        {
            Recycler *recycler = threadContext->GetRecycler();
            if (recycler)
            {
                recycler->EnsureNotCollecting();
                recycler->CollectNow<CollectNowFinalGC>();
                Assert(!recycler->CollectionInProgress());
            }
        }
#endif

        runtime->SetBeforeCollectCallback(nullptr, nullptr);
        threadContext->CloseForJSRT();
        HeapDelete(threadContext);

        HeapDelete(runtime);

        scope.Invalidate();

        return JsNoError;
    });
}